

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QRenderRule::fixupBorder(QRenderRule *this,int nativeWidth)

{
  QSharedDataPointer<QStyleSheetBorderData> *this_00;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  char cVar4;
  QStyleSheetBorderData *pQVar5;
  QStyleSheetPaletteData *pQVar6;
  QStyleSheetBorderImageData *pQVar7;
  int i;
  long lVar8;
  byte bVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined8 local_48;
  QBrush color;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->bd).d.ptr == (QStyleSheetBorderData *)0x0) goto LAB_003402e5;
  this_00 = &this->bd;
  pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
  if ((pQVar5->bi).d.ptr != (QStyleSheetBorderImageData *)0x0) {
    pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
    QSharedDataPointer<QStyleSheetBorderImageData>::operator->(&pQVar5->bi);
    cVar4 = QPixmap::isNull();
    if (cVar4 == '\0') {
      pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
      pQVar7 = QSharedDataPointer::operator_cast_to_QStyleSheetBorderImageData_
                         ((QSharedDataPointer *)&pQVar5->bi);
      if (pQVar7->cuts[0] == -1) {
        pQVar5 = (this_00->d).ptr;
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          pQVar7->cuts[lVar10] = pQVar5->borders[lVar10];
        }
      }
      goto LAB_003402e5;
    }
  }
  pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
  QSharedDataPointer<QStyleSheetBorderImageData>::reset
            (&pQVar5->bi,(QStyleSheetBorderImageData *)0x0);
  _color = &DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = QSharedDataPointer::operator_cast_to_QStyleSheetPaletteData_
                     ((QSharedDataPointer *)&this->pal);
  if (pQVar6 == (QStyleSheetPaletteData *)0x0) {
    QBrush::QBrush(&color);
  }
  else {
    pQVar6 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(&this->pal);
    QBrush::QBrush(&color,&pQVar6->foreground);
  }
  pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
  if ((pQVar5->radii[0].wd.m_i < 0) || (pQVar5->radii[0].ht.m_i < 0)) {
    pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
    if ((-1 < pQVar5->radii[1].wd.m_i) && (-1 < pQVar5->radii[1].ht.m_i)) goto LAB_003401f5;
    pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
    if ((-1 < pQVar5->radii[2].wd.m_i) && (-1 < pQVar5->radii[2].ht.m_i)) goto LAB_003401f5;
    pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
    bVar9 = (byte)((byte)((uint)pQVar5->radii[3].ht.m_i >> 0x18) |
                  (byte)((uint)pQVar5->radii[3].wd.m_i >> 0x18)) >> 7;
  }
  else {
LAB_003401f5:
    bVar9 = 0;
  }
  lVar10 = 0x18;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
    pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
    if (*(int *)((long)pQVar5->styles + lVar8) == 0xc && bVar9 == 0) {
      pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
      *(undefined4 *)((long)pQVar5->styles + lVar8) = 1;
    }
    pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
    iVar1 = *(int *)((long)pQVar5->styles + lVar8);
    if (iVar1 == 0xc) {
      pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
      if (*(int *)((long)pQVar5->borders + lVar8) == 0) {
        pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
        *(int *)((long)pQVar5->borders + lVar8) = nativeWidth;
      }
LAB_003402a7:
      pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
      if (*(int *)(*(long *)((long)pQVar5->borders + lVar8 * 2 + 0x14) + 4) == 0) {
        pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
        QBrush::operator=((QBrush *)((long)pQVar5->borders + lVar10 + -4),&color);
      }
    }
    else {
      if (iVar1 != 1) goto LAB_003402a7;
      QBrush::QBrush((QBrush *)&local_48);
      pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
      uVar3 = *(undefined8 *)((long)pQVar5->borders + lVar8 * 2 + 0x14);
      *(undefined8 *)((long)pQVar5->borders + lVar8 * 2 + 0x14) = local_48;
      local_48 = uVar3;
      QBrush::~QBrush((QBrush *)&local_48);
      pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
      *(undefined4 *)((long)pQVar5->borders + lVar8) = 0;
    }
    lVar10 = lVar10 + 8;
  }
  QBrush::~QBrush(&color);
LAB_003402e5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::fixupBorder(int nativeWidth)
{
    if (bd == nullptr)
        return;

    if (!bd->hasBorderImage() || bd->bi->pixmap.isNull()) {
        bd->bi = nullptr;
        // ignore the color, border of edges that have none border-style
        QBrush color = pal ? pal->foreground : QBrush();
        const bool hasRadius = bd->radii[0].isValid() || bd->radii[1].isValid()
                               || bd->radii[2].isValid() || bd->radii[3].isValid();
        for (int i = 0; i < 4; i++) {
            if ((bd->styles[i] == BorderStyle_Native) && hasRadius)
                bd->styles[i] = BorderStyle_None;

            switch (bd->styles[i]) {
            case BorderStyle_None:
                // border-style: none forces width to be 0
                bd->colors[i] = QBrush();
                bd->borders[i] = 0;
                break;
            case BorderStyle_Native:
                if (bd->borders[i] == 0)
                    bd->borders[i] = nativeWidth;
                Q_FALLTHROUGH();
            default:
                if (bd->colors[i].style() == Qt::NoBrush) // auto-acquire 'color'
                    bd->colors[i] = color;
                break;
            }
        }

        return;
    }

    // inspect the border image
    QStyleSheetBorderImageData *bi = bd->bi;
    if (bi->cuts[0] == -1) {
        for (int i = 0; i < 4; i++) // assume, cut = border
            bi->cuts[i] = int(border()->borders[i]);
    }
}